

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  string *__lhs;
  string *in_RSI;
  long *in_RDI;
  Message *unaff_retaddr;
  string *in_stack_00000008;
  DescriptorBuilder *in_stack_00000010;
  string message;
  undefined8 in_stack_ffffffffffffff18;
  int index_00;
  FileDescriptorProto *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_c8 [32];
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [32];
  string local_38 [40];
  long *plVar1;
  ErrorLocation location;
  
  index_00 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  plVar1 = in_RDI;
  std::__cxx11::string::string(local_38);
  location = (ErrorLocation)((ulong)plVar1 >> 0x20);
  if (*(long *)(*in_RDI + 8) == 0) {
    __lhs = FileDescriptorProto::dependency_abi_cxx11_(in_stack_ffffffffffffff20,index_00);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff20);
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
  }
  else {
    in_stack_ffffffffffffff20 =
         (FileDescriptorProto *)
         FileDescriptorProto::dependency_abi_cxx11_(in_stack_ffffffffffffff20,index_00);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
    std::__cxx11::string::operator=(local_38,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
  }
  FileDescriptorProto::dependency_abi_cxx11_(in_stack_ffffffffffffff20,index_00);
  AddError(in_stack_00000010,in_stack_00000008,unaff_retaddr,location,in_RSI);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DescriptorBuilder::AddImportError(const FileDescriptorProto& proto,
                                       int index) {
  std::string message;
  if (pool_->fallback_database_ == nullptr) {
    message = "Import \"" + proto.dependency(index) + "\" has not been loaded.";
  } else {
    message = "Import \"" + proto.dependency(index) +
              "\" was not found or had errors.";
  }
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT, message);
}